

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * __thiscall
Character::GetChatLogDump_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  bool bVar1;
  reference pbVar2;
  string *line;
  iterator __end1;
  iterator __begin1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Character *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)&__end1._M_node,&this->chat_log);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((iterator *)&line,&this->chat_log);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&line), bVar1) {
    pbVar2 = std::
             _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                          *)&__end1._M_node);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)&__end1._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Character::GetChatLogDump()
{
	std::string result;

	for (const std::string& line : chat_log)
	{
		result += line;
		result += "\r\n";
	}

	return result;
}